

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDiurnal_kry.c
# Opt level: O3

int Precond(sunrealtype tn,N_Vector u,N_Vector fu,int jok,int *jcurPtr,sunrealtype gamma,
           void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long *plVar6;
  undefined8 uVar7;
  double *pdVar8;
  double *pdVar9;
  double dVar10;
  double dVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  double *pdVar17;
  void *pvVar18;
  undefined4 local_88;
  
  lVar14 = (long)user_data + 800;
  lVar13 = N_VGetArrayPointer(SUB84(tn,0));
  if (jok == 0) {
    dVar1 = *(double *)((long)user_data + 0x960);
    dVar2 = *(double *)((long)user_data + 0x978);
    dVar3 = *(double *)((long)user_data + 0x990);
    dVar4 = *(double *)((long)user_data + 0x980);
    pdVar15 = (double *)(lVar13 + 8);
    lVar13 = 0;
    do {
      dVar10 = ((double)(int)lVar13 + -0.5) * dVar2 + 30.0;
      dVar11 = exp(dVar10 * 0.2);
      dVar10 = exp((dVar2 + dVar10) * 0.2);
      dVar10 = dVar10 * dVar3 + dVar11 * dVar3 + dVar4 + dVar4;
      lVar16 = -800;
      pdVar17 = pdVar15;
      do {
        plVar6 = *(long **)(lVar14 + 800 + lVar16);
        uVar7 = *(undefined8 *)(lVar14 + lVar16);
        dVar11 = *pdVar17;
        pdVar8 = (double *)*plVar6;
        dVar5 = pdVar17[-1];
        *pdVar8 = (dVar11 * -4.66e-16 + -6.031000000000001) - dVar10;
        pdVar9 = (double *)plVar6[1];
        *pdVar9 = dVar5 * -4.66e-16 + dVar1;
        pdVar8[1] = dVar11 * -4.66e-16 + 6.031000000000001;
        pdVar9[1] = (dVar5 * -4.66e-16 + -dVar1) - dVar10;
        SUNDlsMat_denseCopy(plVar6,uVar7,2,2);
        pdVar17 = pdVar17 + 2;
        lVar16 = lVar16 + 0x50;
      } while (lVar16 != 0);
      lVar13 = lVar13 + 1;
      pdVar15 = pdVar15 + 0x14;
      lVar14 = lVar14 + 8;
    } while (lVar13 != 10);
    iVar12 = 1;
  }
  else {
    lVar13 = 0;
    do {
      lVar16 = -800;
      do {
        SUNDlsMat_denseCopy(*(undefined8 *)(lVar14 + 800 + lVar16),*(undefined8 *)(lVar14 + lVar16),
                            2,2);
        lVar16 = lVar16 + 0x50;
      } while (lVar16 != 0);
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 8;
    } while (lVar13 != 10);
    iVar12 = 0;
  }
  *jcurPtr = iVar12;
  lVar14 = 0;
  pvVar18 = user_data;
  do {
    lVar13 = -800;
    do {
      local_88 = SUB84(gamma,0);
      SUNDlsMat_denseScale(local_88,*(undefined8 *)((long)pvVar18 + lVar13 + 800),2,2);
      lVar13 = lVar13 + 0x50;
    } while (lVar13 != 0);
    lVar14 = lVar14 + 1;
    pvVar18 = (void *)((long)pvVar18 + 8);
  } while (lVar14 != 10);
  lVar14 = 0;
  do {
    lVar13 = 0;
    do {
      SUNDlsMat_denseAddIdentity(*(undefined8 *)((long)user_data + lVar13 * 8),2);
      lVar16 = SUNDlsMat_denseGETRF
                         (*(undefined8 *)((long)user_data + lVar13 * 8),2,2,
                          *(undefined8 *)((long)user_data + lVar13 * 8 + 0x640));
      if (lVar16 != 0) {
        return 1;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 10);
    lVar14 = lVar14 + 1;
    user_data = (void *)((long)user_data + 0x50);
  } while (lVar14 != 10);
  return 0;
}

Assistant:

static int Precond(sunrealtype tn, N_Vector u, N_Vector fu, sunbooleantype jok,
                   sunbooleantype* jcurPtr, sunrealtype gamma, void* user_data)
{
  sunrealtype c1, c2, cydn, cyup, diag, ydn, yup, q4coef, dely, verdco, hordco;
  sunrealtype**(*P)[MY], **(*Jbd)[MY];
  sunindextype*(*pivot)[MY], retval;
  int jx, jy;
  sunrealtype *udata, **a, **j;
  UserData data;

  /* Make local copies of pointers in user_data, and of pointer to u's data */

  data  = (UserData)user_data;
  P     = data->P;
  Jbd   = data->Jbd;
  pivot = data->pivot;
  udata = N_VGetArrayPointer(u);

  if (jok)
  {
    /* jok = SUNTRUE: Copy Jbd to P */

    for (jy = 0; jy < MY; jy++)
    {
      for (jx = 0; jx < MX; jx++)
      {
        SUNDlsMat_denseCopy(Jbd[jx][jy], P[jx][jy], NUM_SPECIES, NUM_SPECIES);
      }
    }

    *jcurPtr = SUNFALSE;
  }

  else
  {
    /* jok = SUNFALSE: Generate Jbd from scratch and copy to P */

    /* Make local copies of problem variables, for efficiency. */

    q4coef = data->q4;
    dely   = data->dy;
    verdco = data->vdco;
    hordco = data->hdco;

    /* Compute 2x2 diagonal Jacobian blocks (using q4 values
       computed on the last f call).  Load into P. */

    for (jy = 0; jy < MY; jy++)
    {
      ydn  = YMIN + (jy - SUN_RCONST(0.5)) * dely;
      yup  = ydn + dely;
      cydn = verdco * exp(SUN_RCONST(0.2) * ydn);
      cyup = verdco * exp(SUN_RCONST(0.2) * yup);
      diag = -(cydn + cyup + TWO * hordco);
      for (jx = 0; jx < MX; jx++)
      {
        c1            = IJKth(udata, 1, jx, jy);
        c2            = IJKth(udata, 2, jx, jy);
        j             = Jbd[jx][jy];
        a             = P[jx][jy];
        IJth(j, 1, 1) = (-Q1 * C3 - Q2 * c2) + diag;
        IJth(j, 1, 2) = -Q2 * c1 + q4coef;
        IJth(j, 2, 1) = Q1 * C3 - Q2 * c2;
        IJth(j, 2, 2) = (-Q2 * c1 - q4coef) + diag;
        SUNDlsMat_denseCopy(j, a, NUM_SPECIES, NUM_SPECIES);
      }
    }

    *jcurPtr = SUNTRUE;
  }

  /* Scale by -gamma */

  for (jy = 0; jy < MY; jy++)
  {
    for (jx = 0; jx < MX; jx++)
    {
      SUNDlsMat_denseScale(-gamma, P[jx][jy], NUM_SPECIES, NUM_SPECIES);
    }
  }

  /* Add identity matrix and do LU decompositions on blocks in place. */

  for (jx = 0; jx < MX; jx++)
  {
    for (jy = 0; jy < MY; jy++)
    {
      SUNDlsMat_denseAddIdentity(P[jx][jy], NUM_SPECIES);
      retval = SUNDlsMat_denseGETRF(P[jx][jy], NUM_SPECIES, NUM_SPECIES,
                                    pivot[jx][jy]);
      if (retval != 0) { return (1); }
    }
  }

  return (0);
}